

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int MRIStepGetCurrentCoupling(void *arkode_mem,MRIStepCoupling *MRIC)

{
  undefined8 *in_RSI;
  int retval;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  local_4 = mriStep_AccessARKODEStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,(ARKodeMRIStepMem *)0x1807c9);
  if (local_4 == 0) {
    *in_RSI = *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x48);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int MRIStepGetCurrentCoupling(void* arkode_mem, MRIStepCoupling* MRIC)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeMRIStepMem structures */
  retval = mriStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* get coupling structure from step_mem */
  *MRIC = step_mem->MRIC;

  return (ARK_SUCCESS);
}